

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O2

QString * decorate(QString *__return_storage_ptr__,QString *text,Renderer *r,Context *ctx)

{
  QArrayDataPointer<char16_t> local_40;
  QArrayDataPointer<char16_t> local_28;
  
  Mustache::Renderer::render((QString *)&local_28,r,text,ctx);
  operator+((QString *)&local_40,"~",(QString *)&local_28);
  operator+(__return_storage_ptr__,(QString *)&local_40,"~");
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  return __return_storage_ptr__;
}

Assistant:

static QString decorate(const QString& text, Mustache::Renderer* r, Mustache::Context* ctx)
{
	return "~" + r->render(text, ctx) + "~";
}